

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmCommonTargetGenerator::AppendFortranPreprocessFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source,
          PreprocessFlagsRequired requires_pp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *this_02;
  FortranPreprocess FVar3;
  string *psVar4;
  char *__s;
  string_view value;
  string_view value_00;
  string srcpp;
  allocator<char> local_71;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Fortran_PREPROCESS","");
  psVar4 = cmSourceFile::GetSafeProperty(source,&local_70);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  value._M_str = (char *)local_50;
  value._M_len = local_48;
  FVar3 = cmOutputConverter::GetFortranPreprocess(value);
  if (FVar3 == Unset) {
    this_00 = this->GeneratorTarget;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Fortran_PREPROCESS","");
    psVar4 = cmGeneratorTarget::GetSafeProperty(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    value_00._M_str = (psVar4->_M_dataplus)._M_p;
    value_00._M_len = psVar4->_M_string_length;
    FVar3 = cmOutputConverter::GetFortranPreprocess(value_00);
  }
  if (FVar3 == NotNeeded) {
    __s = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_OFF";
  }
  else {
    if ((FVar3 != Needed) || (requires_pp != YES)) goto LAB_0042f81e;
    __s = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_ON";
  }
  this_01 = this->Makefile;
  this_02 = this->LocalCommonGenerator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
  psVar4 = cmMakefile::GetSafeDefinition(this_01,&local_70);
  cmLocalGenerator::AppendCompileOptions(&this_02->super_cmLocalGenerator,flags,psVar4,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_0042f81e:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranPreprocessFlags(
  std::string& flags, cmSourceFile const& source,
  PreprocessFlagsRequired requires_pp)
{
  const std::string srcpp = source.GetSafeProperty("Fortran_PREPROCESS");
  cmOutputConverter::FortranPreprocess preprocess =
    cmOutputConverter::GetFortranPreprocess(srcpp);
  if (preprocess == cmOutputConverter::FortranPreprocess::Unset) {
    std::string const& tgtpp =
      this->GeneratorTarget->GetSafeProperty("Fortran_PREPROCESS");
    preprocess = cmOutputConverter::GetFortranPreprocess(tgtpp);
  }
  const char* var = nullptr;
  switch (preprocess) {
    case cmOutputConverter::FortranPreprocess::Needed:
      if (requires_pp == PreprocessFlagsRequired::YES) {
        var = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_ON";
      }
      break;
    case cmOutputConverter::FortranPreprocess::NotNeeded:
      var = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_OFF";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendCompileOptions(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}